

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O3

distFcnElement2d * __thiscall
amrex::SplineDistFcnElement2d::newDistFcnElement2d(SplineDistFcnElement2d *this)

{
  _func_int **pp_Var1;
  distFcnElement2d *pdVar2;
  
  pdVar2 = (distFcnElement2d *)operator_new(0x98);
  pdVar2->_vptr_distFcnElement2d = (_func_int **)&PTR_newDistFcnElement2d_0080e040;
  memset((vector<double,_std::allocator<double>_> *)(pdVar2 + 1),0,0x90);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar2 + 1),&this->control_points_x);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar2 + 4),&this->control_points_y);
  pp_Var1 = (_func_int **)(this->bc_pt_start).vect[1];
  pdVar2[7]._vptr_distFcnElement2d = (_func_int **)(this->bc_pt_start).vect[0];
  pdVar2[8]._vptr_distFcnElement2d = pp_Var1;
  pdVar2[9]._vptr_distFcnElement2d = (_func_int **)(this->bc_pt_start).vect[2];
  pp_Var1 = (_func_int **)(this->bc_pt_end).vect[1];
  pdVar2[10]._vptr_distFcnElement2d = (_func_int **)(this->bc_pt_end).vect[0];
  pdVar2[0xb]._vptr_distFcnElement2d = pp_Var1;
  pdVar2[0xc]._vptr_distFcnElement2d = (_func_int **)(this->bc_pt_end).vect[2];
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar2 + 0xd),&this->Dx);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)(pdVar2 + 0x10),&this->Dy);
  return pdVar2;
}

Assistant:

distFcnElement2d* SplineDistFcnElement2d::newDistFcnElement2d() const {
  SplineDistFcnElement2d* newSpline = new SplineDistFcnElement2d();
  newSpline->control_points_x = control_points_x;
  newSpline->control_points_y = control_points_y;
  newSpline->bc_pt_start = bc_pt_start;
  newSpline->bc_pt_end = bc_pt_end;
  newSpline->Dx = Dx;
  newSpline->Dy = Dy;
  return static_cast<distFcnElement2d*>(newSpline);
}